

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::Context::Context
          (Context *this,string *name_,TestContext *testContext_,RenderContext *renderContext_,
          FloatFormat *floatFormat_,FloatFormat *highpFormat_,Precision precision_,
          ShaderType shaderType_,size_t numRandoms_)

{
  FloatFormat *highpFormat__local;
  FloatFormat *floatFormat__local;
  RenderContext *renderContext__local;
  TestContext *testContext__local;
  string *name__local;
  Context *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name_);
  this->testContext = testContext_;
  this->renderContext = renderContext_;
  memcpy(&this->floatFormat,floatFormat_,0x28);
  memcpy(&this->highpFormat,highpFormat_,0x28);
  this->precision = precision_;
  this->shaderType = shaderType_;
  this->numRandoms = numRandoms_;
  return;
}

Assistant:

Context		(const string&		name_,
				 TestContext&		testContext_,
				 RenderContext&		renderContext_,
				 const FloatFormat&	floatFormat_,
				 const FloatFormat&	highpFormat_,
				 Precision			precision_,
				 ShaderType			shaderType_,
				 size_t				numRandoms_)
		: name				(name_)
		, testContext		(testContext_)
		, renderContext		(renderContext_)
		, floatFormat		(floatFormat_)
		, highpFormat		(highpFormat_)
		, precision			(precision_)
		, shaderType		(shaderType_)
		, numRandoms		(numRandoms_) {}